

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

void __thiscall
menuwindow::menuwindow
          (menuwindow *this,Fl_Menu_Item *m,int X,int Y,int Wp,int Hp,Fl_Menu_Item *picked,
          Fl_Menu_Item *t,int menubar,int menubar_title,int right_edge)

{
  uchar *buf;
  Fl_Boxtype FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  menutitle *pmVar9;
  double dVar10;
  int local_12c;
  Fl_Color local_d0;
  int ht_1;
  int dy_1;
  int ht;
  int dy;
  int BW;
  char *s;
  char *k;
  int local_70;
  int w1;
  int hh;
  int W;
  int Htitle;
  int Wtitle;
  int hotModsw;
  int hotKeysw;
  Fl_Menu_Item *m1;
  int j;
  int local_40;
  int local_3c;
  int ty;
  int tx;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  int Hp_local;
  int Wp_local;
  int Y_local;
  int X_local;
  Fl_Menu_Item *m_local;
  menuwindow *this_local;
  
  scr_y = Hp;
  scr_x = Wp;
  Hp_local = Y;
  Wp_local = X;
  _Y_local = m;
  m_local = (Fl_Menu_Item *)this;
  Fl_Menu_Window::Fl_Menu_Window(&this->super_Fl_Menu_Window,X,Y,Wp,Hp,(char *)0x0);
  (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.super_Fl_Widget
  ._vptr_Fl_Widget = (_func_int **)&PTR__menuwindow_002e58e8;
  local_3c = Wp_local;
  local_40 = Hp_local;
  Fl::screen_work_area(&scr_w,&scr_h,&tx,&ty);
  Fl_Group::end((Fl_Group *)this);
  Fl_Window::set_modal((Fl_Window *)this);
  Fl_Window::clear_border((Fl_Window *)this);
  Fl_Window::set_menu_window((Fl_Window *)this);
  this->menu = _Y_local;
  if (_Y_local != (Fl_Menu_Item *)0x0) {
    _Y_local = Fl_Menu_Item::first(_Y_local);
  }
  this->drawn_selected = -1;
  if (button == (Fl_Menu_ *)0x0) {
    Fl_Widget::box((Fl_Widget *)this,FL_UP_BOX);
  }
  else {
    FVar1 = Fl_Widget::box(&button->super_Fl_Widget);
    Fl_Widget::box((Fl_Widget *)this,FVar1);
    FVar1 = Fl_Widget::box((Fl_Widget *)this);
    if ((FVar1 == FL_NO_BOX) || (FVar1 = Fl_Widget::box((Fl_Widget *)this), FVar1 == FL_FLAT_BOX)) {
      Fl_Widget::box((Fl_Widget *)this,FL_UP_BOX);
    }
  }
  if ((button == (Fl_Menu_ *)0x0) || (pcVar7 = Fl::scheme(), pcVar7 != (char *)0x0)) {
    local_d0 = 0x31;
  }
  else {
    local_d0 = Fl_Widget::color(&button->super_Fl_Widget);
  }
  Fl_Widget::color((Fl_Widget *)this,local_d0);
  this->selected = -1;
  m1._0_4_ = 0;
  if (_Y_local != (Fl_Menu_Item *)0x0) {
    _hotModsw = _Y_local;
    while( true ) {
      if (picked != (Fl_Menu_Item *)0x0) {
        if (_hotModsw == picked) {
          this->selected = (int)m1;
          picked = (Fl_Menu_Item *)0x0;
        }
        else if (picked < _hotModsw) {
          this->selected = (int)m1 + -1;
          picked = (Fl_Menu_Item *)0x0;
          scr_y = 0;
          scr_x = 0;
        }
      }
      if (_hotModsw->text == (char *)0x0) break;
      _hotModsw = Fl_Menu_Item::next(_hotModsw,1);
      m1._0_4_ = (int)m1 + 1;
    }
  }
  this->numitems = (int)m1;
  if (menubar == 0) {
    this->itemheight = 1;
    Wtitle = 0;
    Htitle = 0;
    W = 0;
    hh = 0;
    if (t != (Fl_Menu_Item *)0x0) {
      iVar2 = Fl_Menu_Item::measure(t,&hh,button);
      W = iVar2 + 0xc;
    }
    w1 = 0;
    if (_Y_local != (Fl_Menu_Item *)0x0) {
      for (; _Y_local->text != (char *)0x0; _Y_local = Fl_Menu_Item::next(_Y_local,1)) {
        k._4_4_ = Fl_Menu_Item::measure(_Y_local,&local_70,button);
        if (this->itemheight < local_70 + 4) {
          this->itemheight = local_70 + 4;
        }
        if ((_Y_local->flags & 0x60U) != 0) {
          k._4_4_ = FL_NORMAL_SIZE + k._4_4_;
        }
        if (w1 < k._4_4_) {
          w1 = k._4_4_;
        }
        if (_Y_local->shortcut_ != 0) {
          pcVar7 = fl_shortcut_label(_Y_local->shortcut_,&s);
          buf = (uchar *)CONCAT44(s._4_4_,(int)s);
          sVar8 = strlen((char *)buf);
          iVar2 = fl_utf_nb_char(buf,(int)sVar8);
          if (iVar2 < 5) {
            dVar10 = fl_width(pcVar7,(int)s - (int)pcVar7);
            k._4_4_ = (int)dVar10;
            if (Htitle < k._4_4_) {
              Htitle = k._4_4_;
            }
            dVar10 = fl_width((char *)CONCAT44(s._4_4_,(int)s));
            k._4_4_ = (int)dVar10 + 4;
            if (Wtitle < k._4_4_) {
              Wtitle = k._4_4_;
            }
          }
          else {
            dVar10 = fl_width(pcVar7);
            k._4_4_ = (int)dVar10 + 4;
            if (Htitle + Wtitle < k._4_4_) {
              Htitle = k._4_4_ - Wtitle;
            }
          }
        }
        if (((_Y_local->labelcolor_ != 0) || (pcVar7 = Fl::scheme(), pcVar7 != (char *)0x0)) ||
           (1 < _Y_local->labeltype_)) {
          Fl_Menu_Window::clear_overlay(&this->super_Fl_Menu_Window);
        }
      }
    }
    this->shortcutWidth = Wtitle;
    if ((-1 < this->selected) && (scr_x == 0)) {
      Wp_local = Wp_local - w1 / 2;
    }
    FVar1 = Fl_Widget::box((Fl_Widget *)this);
    iVar2 = Fl::box_dx(FVar1);
    w1 = Wtitle + Htitle + iVar2 * 2 + 7 + w1;
    if (w1 < scr_x) {
      w1 = scr_x;
    }
    if (w1 < W) {
      w1 = W;
    }
    if (Wp_local < scr_w) {
      Wp_local = scr_w;
    }
    if ((scr_w + tx) - w1 < Wp_local) {
      Wp_local = (scr_w + tx) - w1;
    }
    Fl_Widget::x((Fl_Widget *)this,Wp_local);
    Fl_Widget::w((Fl_Widget *)this,w1);
    if (this->numitems == 0) {
      local_12c = 0;
    }
    else {
      local_12c = this->itemheight * this->numitems + -4;
    }
    Fl_Widget::h((Fl_Widget *)this,local_12c + 3 + iVar2 * 2);
    if (this->selected < 0) {
      iVar3 = Hp_local + scr_y;
      Hp_local = iVar3;
      iVar4 = Fl_Widget::h((Fl_Widget *)this);
      iVar6 = Hp_local;
      if ((scr_h + ty < iVar3 + iVar4) &&
         (iVar4 = Fl_Widget::h((Fl_Widget *)this), iVar3 = Hp_local, scr_h <= iVar6 - iVar4)) {
        if (scr_y < 2) {
          if (t == (Fl_Menu_Item *)0x0) {
            iVar4 = Fl_Widget::h((Fl_Widget *)this);
            iVar6 = this->itemheight;
            FVar1 = Fl_Widget::box((Fl_Widget *)this);
            iVar5 = Fl::box_dy(FVar1);
            Hp_local = (iVar3 - iVar4) + iVar6 + iVar5;
          }
          else {
            iVar6 = Hp_local - this->itemheight;
            iVar3 = Fl_Widget::h((Fl_Widget *)this);
            FVar1 = Fl_Widget::box((Fl_Widget *)this);
            iVar4 = Fl::box_dh(FVar1);
            Hp_local = (iVar6 - iVar3) - iVar4;
          }
        }
        else {
          iVar6 = Hp_local - scr_y;
          iVar3 = Fl_Widget::h((Fl_Widget *)this);
          Hp_local = iVar6 - iVar3;
        }
      }
    }
    else {
      Hp_local = ((Hp_local + (scr_y - this->itemheight) / 2) - this->selected * this->itemheight) -
                 iVar2;
    }
    if (_Y_local == (Fl_Menu_Item *)0x0) {
      Fl_Widget::y((Fl_Widget *)this,Hp_local + -2);
      Fl_Widget::w((Fl_Widget *)this,1);
      Fl_Widget::h((Fl_Widget *)this,1);
    }
    else {
      Fl_Widget::y((Fl_Widget *)this,Hp_local);
    }
    if (t == (Fl_Menu_Item *)0x0) {
      this->title = (menutitle *)0x0;
    }
    else if (menubar_title == 0) {
      iVar2 = hh + 3 + iVar2 * 2;
      pmVar9 = (menutitle *)operator_new(0xf8);
      menutitle::menutitle(pmVar9,Wp_local,(Hp_local - iVar2) + -2,W,iVar2,t);
      this->title = pmVar9;
    }
    else {
      FVar1 = Fl_Widget::box(&button->super_Fl_Widget);
      iVar2 = Fl::box_dy(FVar1);
      iVar6 = Fl_Widget::h(&button->super_Fl_Widget);
      iVar6 = iVar6 + (iVar2 + 1) * -2;
      pmVar9 = (menutitle *)operator_new(0xf8);
      menutitle::menutitle(pmVar9,local_3c,(local_40 - iVar6) - (iVar2 + 1),W,iVar6,t);
      this->title = pmVar9;
    }
  }
  else {
    this->itemheight = 0;
    this->title = (menutitle *)0x0;
  }
  return;
}

Assistant:

menuwindow::menuwindow(const Fl_Menu_Item* m, int X, int Y, int Wp, int Hp,
		       const Fl_Menu_Item* picked, const Fl_Menu_Item* t, 
		       int menubar, int menubar_title, int right_edge)
  : Fl_Menu_Window(X, Y, Wp, Hp, 0)
{
  int scr_x, scr_y, scr_w, scr_h;
  int tx = X, ty = Y;

  Fl::screen_work_area(scr_x, scr_y, scr_w, scr_h);
  if (!right_edge || right_edge > scr_x+scr_w) right_edge = scr_x+scr_w;

  end();
  set_modal();
  clear_border();
  set_menu_window();
  menu = m;
  if (m) m = m->first(); // find the first item that needs to be rendered
  drawn_selected = -1;
  if (button) {
    box(button->box());
    if (box() == FL_NO_BOX || box() == FL_FLAT_BOX) box(FL_UP_BOX);
  } else {
    box(FL_UP_BOX);
  }
  color(button && !Fl::scheme() ? button->color() : FL_GRAY);
  selected = -1;
  {
    int j = 0;
    if (m) for (const Fl_Menu_Item* m1=m; ; m1 = m1->next(), j++) {
      if (picked) {
        if (m1 == picked) {selected = j; picked = 0;}
        else if (m1 > picked) {selected = j-1; picked = 0; Wp = Hp = 0;}
    }
    if (!m1->text) break;
  }
  numitems = j;}

  if (menubar) {
    itemheight = 0;
    title = 0;
    return;
  }

  itemheight = 1;

  int hotKeysw = 0;
  int hotModsw = 0;
  int Wtitle = 0;
  int Htitle = 0;
  if (t) Wtitle = t->measure(&Htitle, button) + 12;
  int W = 0;
  if (m) for (; m->text; m = m->next()) {
    int hh; 
    int w1 = m->measure(&hh, button);
    if (hh+LEADING>itemheight) itemheight = hh+LEADING;
    if (m->flags&(FL_SUBMENU|FL_SUBMENU_POINTER)) 
      w1 += FL_NORMAL_SIZE;
    if (w1 > W) W = w1;
    // calculate the maximum width of all shortcuts
    if (m->shortcut_) {
      // s is a pointer to the UTF-8 string for the entire shortcut
      // k points only to the key part (minus the modifier keys)
      const char *k, *s = fl_shortcut_label(m->shortcut_, &k);
      if (fl_utf_nb_char((const unsigned char*)k, (int) strlen(k))<=4) {
        // a regular shortcut has a right-justified modifier followed by a left-justified key
        w1 = int(fl_width(s, (int) (k-s)));
        if (w1 > hotModsw) hotModsw = w1;
        w1 = int(fl_width(k))+4;
        if (w1 > hotKeysw) hotKeysw = w1;
      } else {
        // a shortcut with a long modifier is right-justified to the menu
        w1 = int(fl_width(s))+4;
        if (w1 > (hotModsw+hotKeysw)) {
          hotModsw = w1-hotKeysw;
        }
      }
    }
    if (m->labelcolor_ || Fl::scheme() || m->labeltype_ > FL_NO_LABEL) clear_overlay();
  }
  shortcutWidth = hotKeysw;
  if (selected >= 0 && !Wp) X -= W/2;
  int BW = Fl::box_dx(box());
  W += hotKeysw+hotModsw+2*BW+7;
  if (Wp > W) W = Wp;
  if (Wtitle > W) W = Wtitle;

  if (X < scr_x) X = scr_x; 
  // this change improves popup submenu positioning at right screen edge, 
  // but it makes right_edge argument useless
  //if (X > scr_x+scr_w-W) X = right_edge-W;
  if (X > scr_x+scr_w-W) X = scr_x+scr_w-W;
  x(X); w(W);
  h((numitems ? itemheight*numitems-LEADING : 0)+2*BW+3);
  if (selected >= 0) {
    Y = Y+(Hp-itemheight)/2-selected*itemheight-BW;
  } else {
    Y = Y+Hp;
    // if the menu hits the bottom of the screen, we try to draw
    // it above the menubar instead. We will not adjust any menu
    // that has a selected item.
    if (Y+h()>scr_y+scr_h && Y-h()>=scr_y) {
      if (Hp>1) {
        // if we know the height of the Fl_Menu_, use it
        Y = Y-Hp-h();
      } else if (t) {
        // assume that the menubar item height relates to the first
        // menuitem as well
        Y = Y-itemheight-h()-Fl::box_dh(box());
      } else {
        // draw the menu to the right
        Y = Y-h()+itemheight+Fl::box_dy(box());
      }
    }
  }
  if (m) y(Y); else {y(Y-2); w(1); h(1);}

  if (t) {
    if (menubar_title) {
      int dy = Fl::box_dy(button->box())+1;
      int ht = button->h()-dy*2;
      title = new menutitle(tx, ty-ht-dy, Wtitle, ht, t);
    } else {
      int dy = 2;
      int ht = Htitle+2*BW+3;
      title = new menutitle(X, Y-ht-dy, Wtitle, ht, t);
    }
  } else {
    title = 0;
  }
}